

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O3

QString * msgErrorSettingEllipticCurves(QString *__return_storage_ptr__,QString *why)

{
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QArrayData *local_38 [3];
  QString *local_20;
  
  local_20 = *(QString **)(in_FS_OFFSET + 0x28);
  QMetaObject::tr((char *)local_38,(char *)&QSslSocket::staticMetaObject,0x13c547);
  QVar1.m_size = (size_t)local_38;
  QVar1.field_0.m_data = __return_storage_ptr__;
  QString::arg_impl(QVar1,(int)(why->d).ptr,(QChar)(char16_t)(why->d).size);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static inline QString msgErrorSettingEllipticCurves(const QString &why)
{
    return QSslSocket::tr("Error when setting the elliptic curves (%1)").arg(why);
}